

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

float GD::compute_rate_decay<false,1ul,2ul>(power_data *s,float *fw)

{
  long in_RSI;
  float *in_RDI;
  float fVar1;
  float fVar2;
  float rate_decay;
  weight *w;
  
  fVar1 = powf(*(float *)(in_RSI + 4),*in_RDI);
  fVar2 = powf(*(float *)(in_RSI + 8) * *(float *)(in_RSI + 8),in_RDI[1]);
  return fVar2 * fVar1;
}

Assistant:

inline float compute_rate_decay(power_data& s, float& fw)
{
  weight* w = &fw;
  float rate_decay = 1.f;
  if (adaptive)
  {
    if (sqrt_rate)
      rate_decay = InvSqrt(w[adaptive]);
    else
      rate_decay = powf(w[adaptive], s.minus_power_t);
  }
  if (normalized)
  {
    if (sqrt_rate)
    {
      float inv_norm = 1.f / w[normalized];
      if (adaptive)
        rate_decay *= inv_norm;
      else
        rate_decay *= inv_norm * inv_norm;
    }
    else
      rate_decay *= powf(w[normalized] * w[normalized], s.neg_norm_power);
  }
  return rate_decay;
}